

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future_std.h
# Opt level: O2

unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
__thiscall
prometheus::detail::
make_unique<prometheus::detail::Endpoint,CivetServer&,std::__cxx11::string_const&>
          (detail *this,CivetServer *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  Endpoint *this_00;
  string local_40;
  
  this_00 = (Endpoint *)operator_new(0x48);
  std::__cxx11::string::string((string *)&local_40,(string *)args_1);
  Endpoint::Endpoint(this_00,args,&local_40);
  *(Endpoint **)this = this_00;
  std::__cxx11::string::~string((string *)&local_40);
  return (__uniq_ptr_data<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>,_true,_true>
          )(__uniq_ptr_data<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}